

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lunasvg.cpp
# Opt level: O3

Bitmap __thiscall
lunasvg::Document::renderToBitmap(Document *this,int width,int height,uint32_t backgroundColor)

{
  float __x;
  float fVar1;
  SVGRootElement *pSVar2;
  _Head_base<0UL,_lunasvg::SVGRootElement_*,_false> _Var3;
  undefined4 in_register_00000034;
  Document *this_00;
  uint32_t in_R8D;
  float fVar4;
  Matrix local_40;
  
  this_00 = (Document *)CONCAT44(in_register_00000034,width);
  pSVar2 = SVGRootElement::updateLayout
                     ((this_00->m_rootElement)._M_t.
                      super___uniq_ptr_impl<lunasvg::SVGRootElement,_std::default_delete<lunasvg::SVGRootElement>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_lunasvg::SVGRootElement_*,_std::default_delete<lunasvg::SVGRootElement>_>
                      .super__Head_base<0UL,_lunasvg::SVGRootElement_*,_false>._M_head_impl);
  __x = pSVar2->m_intrinsicWidth;
  if ((__x == 0.0) && (!NAN(__x))) {
LAB_0010c08c:
    (this->m_rootElement)._M_t.
    super___uniq_ptr_impl<lunasvg::SVGRootElement,_std::default_delete<lunasvg::SVGRootElement>_>.
    _M_t.
    super__Tuple_impl<0UL,_lunasvg::SVGRootElement_*,_std::default_delete<lunasvg::SVGRootElement>_>
    .super__Head_base<0UL,_lunasvg::SVGRootElement_*,_false>._M_head_impl = (SVGRootElement *)0x0;
    return (Bitmap)(plutovg_surface_t *)this;
  }
  fVar1 = ((this_00->m_rootElement)._M_t.
           super___uniq_ptr_impl<lunasvg::SVGRootElement,_std::default_delete<lunasvg::SVGRootElement>_>
           ._M_t.
           super__Tuple_impl<0UL,_lunasvg::SVGRootElement_*,_std::default_delete<lunasvg::SVGRootElement>_>
           .super__Head_base<0UL,_lunasvg::SVGRootElement_*,_false>._M_head_impl)->m_intrinsicHeight
  ;
  if ((fVar1 == 0.0) && (!NAN(fVar1))) goto LAB_0010c08c;
  if ((int)backgroundColor < 1 && height < 1) {
    fVar4 = ceilf(__x);
    height = (int)fVar4;
    fVar4 = fVar1;
  }
  else {
    if (height < 1 || 0 < (int)backgroundColor) {
      if (0 < (int)backgroundColor && height < 1) {
        fVar4 = ceilf(((float)(int)backgroundColor * __x) / fVar1);
        height = (int)fVar4;
      }
      goto LAB_0010c0dc;
    }
    fVar4 = ((float)height * fVar1) / __x;
  }
  fVar4 = ceilf(fVar4);
  backgroundColor = (uint32_t)fVar4;
LAB_0010c0dc:
  local_40.a = (float)height / __x;
  local_40.d = (float)(int)backgroundColor / fVar1;
  local_40.b = 0.0;
  local_40.c = 0.0;
  local_40.e = 0.0;
  local_40.f = 0.0;
  _Var3._M_head_impl = (SVGRootElement *)plutovg_surface_create(height,backgroundColor);
  (this->m_rootElement)._M_t.
  super___uniq_ptr_impl<lunasvg::SVGRootElement,_std::default_delete<lunasvg::SVGRootElement>_>._M_t
  .super__Tuple_impl<0UL,_lunasvg::SVGRootElement_*,_std::default_delete<lunasvg::SVGRootElement>_>.
  super__Head_base<0UL,_lunasvg::SVGRootElement_*,_false>._M_head_impl = _Var3._M_head_impl;
  Bitmap::clear((Bitmap *)this,in_R8D);
  render(this_00,(Bitmap *)this,&local_40);
  return (Bitmap)(plutovg_surface_t *)this;
}

Assistant:

Bitmap Document::renderToBitmap(int width, int height, uint32_t backgroundColor) const
{
    auto intrinsicWidth = m_rootElement->updateLayout()->intrinsicWidth();
    auto intrinsicHeight = m_rootElement->intrinsicHeight();
    if(intrinsicWidth == 0.f || intrinsicHeight == 0.f)
        return Bitmap();
    if(width <= 0 && height <= 0) {
        width = static_cast<int>(std::ceil(intrinsicWidth));
        height = static_cast<int>(std::ceil(intrinsicHeight));
    } else if(width > 0 && height <= 0) {
        height = static_cast<int>(std::ceil(width * intrinsicHeight / intrinsicWidth));
    } else if(height > 0 && width <= 0) {
        width = static_cast<int>(std::ceil(height * intrinsicWidth / intrinsicHeight));
    }

    auto xScale = width / intrinsicWidth;
    auto yScale = height / intrinsicHeight;

    Matrix matrix(xScale, 0, 0, yScale, 0, 0);
    Bitmap bitmap(width, height);
    bitmap.clear(backgroundColor);
    render(bitmap, matrix);
    return bitmap;
}